

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O1

void __thiscall helics::CoreBroker::checkInFlightQueries(CoreBroker *this,GlobalBrokerId brkid)

{
  _Head_base<0UL,_helics::fileops::JsonMapBuilder,_false> *this_00;
  ActionMessage *pAVar1;
  ActionMessage *pAVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  bool bVar5;
  bool bVar6;
  ActionMessage *this_01;
  long lVar7;
  pointer pAVar8;
  long lVar9;
  pointer pAVar10;
  pointer ptVar11;
  pointer ptVar12;
  string str;
  string local_68;
  DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_48;
  pointer local_40;
  JsonMapBuilder *local_38;
  
  ptVar12 = (this->mapBuilders).
            super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ptVar11 = (this->mapBuilders).
            super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ptVar12 != ptVar11) {
    local_48 = &this->activeQueries;
    local_40 = ptVar11;
    do {
      this_00 = &(ptVar12->
                 super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                 ).super__Head_base<0UL,_helics::fileops::JsonMapBuilder,_false>;
      bVar5 = fileops::JsonMapBuilder::isCompleted(&this_00->_M_head_impl);
      if (bVar5) {
        return;
      }
      bVar6 = fileops::JsonMapBuilder::clearComponents(&this_00->_M_head_impl,brkid.gid);
      if (bVar6) {
        local_38 = &this_00->_M_head_impl;
        fileops::JsonMapBuilder::generate_abi_cxx11_(&local_68,&this_00->_M_head_impl);
        pAVar10 = (ptVar12->
                  super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                  ).
                  super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                  .
                  super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
                  ._M_head_impl.
                  super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pAVar8 = *(pointer *)
                  ((long)&(ptVar12->
                          super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                          ).
                          super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                          .
                          super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
                          ._M_head_impl.
                          super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>
                          ._M_impl.super__Vector_impl_data + 8);
        if (1 < (int)((ulong)((long)pAVar8 - (long)pAVar10) >> 3) * -0x1642c859) {
          lVar9 = 0;
          lVar7 = 0;
          do {
            sVar4 = local_68._M_string_length;
            _Var3._M_p = local_68._M_dataplus._M_p;
            if (*(int *)((long)&(pAVar10->payload).buffer + lVar9 + 0xffffffffffffffd0U) ==
                (this->super_BrokerBase).global_broker_id_local.gid) {
              gmlc::concurrency::
              DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::setDelayedValue(local_48,*(int *)((long)&(pAVar10->payload).buffer +
                                                 lVar9 + 0xffffffffffffffc4U),&local_68);
            }
            else {
              if ((byte *)local_68._M_dataplus._M_p ==
                  *(byte **)((long)&(pAVar10->payload).buffer + lVar9 + 0x50U)) {
                *(size_type *)((long)&(pAVar10->payload).buffer + lVar9 + 0x40U) =
                     local_68._M_string_length;
              }
              else {
                SmallBuffer::reserve
                          ((SmallBuffer *)((long)&(pAVar10->payload).buffer + lVar9),
                           local_68._M_string_length);
                *(size_type *)((long)&(pAVar10->payload).buffer + lVar9 + 0x40U) = sVar4;
                if (sVar4 != 0) {
                  memcpy(*(void **)((long)&(pAVar10->payload).buffer + lVar9 + 0x50U),_Var3._M_p,
                         sVar4);
                }
              }
              routeMessage(this,(ActionMessage *)
                                ((long)&(((ptVar12->
                                          super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                                          ).
                                          super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                                          .
                                          super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
                                          ._M_head_impl.
                                          super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->payload).
                                        buffer + lVar9 + -0x40));
            }
            lVar7 = lVar7 + 1;
            pAVar10 = (ptVar12->
                      super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                      ).
                      super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                      .
                      super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
                      ._M_head_impl.
                      super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pAVar8 = *(pointer *)
                      ((long)&(ptVar12->
                              super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                              ).
                              super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                              .
                              super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
                              ._M_head_impl.
                              super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>
                              ._M_impl.super__Vector_impl_data + 8);
            lVar9 = lVar9 + 0xb8;
          } while (lVar7 < (int)((ulong)((long)pAVar8 - (long)pAVar10) >> 3) * -0x1642c859 + -1);
        }
        sVar4 = local_68._M_string_length;
        _Var3._M_p = local_68._M_dataplus._M_p;
        if (pAVar8[-1].dest_id.gid == (this->super_BrokerBase).global_broker_id_local.gid) {
          gmlc::concurrency::
          DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::setDelayedValue(local_48,pAVar8[-1].messageID,&local_68);
        }
        else {
          if ((byte *)local_68._M_dataplus._M_p == pAVar8[-1].payload.heap) {
            pAVar8[-1].payload.bufferSize = local_68._M_string_length;
          }
          else {
            SmallBuffer::reserve(&pAVar8[-1].payload,local_68._M_string_length);
            pAVar8[-1].payload.bufferSize = sVar4;
            if (sVar4 != 0) {
              memcpy(pAVar8[-1].payload.heap,_Var3._M_p,sVar4);
            }
          }
          routeMessage(this,*(pointer *)
                             ((long)&(ptVar12->
                                     super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                                     ).
                                     super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                                     .
                                     super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
                                     ._M_head_impl.
                                     super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>
                                     ._M_impl.super__Vector_impl_data + 8) + -1);
        }
        pAVar1 = (ptVar12->
                 super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                 ).
                 super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                 .
                 super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
                 ._M_head_impl.
                 super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pAVar2 = *(pointer *)
                  ((long)&(ptVar12->
                          super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                          ).
                          super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                          .
                          super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
                          ._M_head_impl.
                          super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>
                          ._M_impl.super__Vector_impl_data + 8);
        this_01 = pAVar1;
        if (pAVar2 != pAVar1) {
          do {
            ActionMessage::~ActionMessage(this_01);
            this_01 = this_01 + 1;
          } while (this_01 != pAVar2);
          *(ActionMessage **)
           ((long)&(ptVar12->
                   super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                   ).
                   super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                   .
                   super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
                   ._M_head_impl.
                   super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>
                   ._M_impl.super__Vector_impl_data + 8) = pAVar1;
        }
        if ((ptVar12->
            super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
            ).
            super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
            .super__Tuple_impl<2UL,_helics::QueryReuse>.
            super__Head_base<2UL,_helics::QueryReuse,_false>._M_head_impl == DISABLED) {
          fileops::JsonMapBuilder::reset(local_38);
        }
        ptVar11 = local_40;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          ptVar11 = local_40;
        }
      }
      ptVar12 = ptVar12 + 1;
    } while (!bVar5 && ptVar12 != ptVar11);
  }
  return;
}

Assistant:

void CoreBroker::sendErrorToImmediateBrokers(int errorCode)
{
    ActionMessage errorCom(CMD_ERROR);
    errorCom.messageID = errorCode;
    broadcast(errorCom);
}